

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_geneve(compiler_state_t *cstate,int vni)

{
  slist *psVar1;
  u_int uVar2;
  int iVar3;
  block *pbVar4;
  slist *psVar5;
  slist *psVar6;
  block *b1;
  block *b1_00;
  slist *psVar7;
  slist *psVar8;
  
  pbVar4 = gen_geneve_check(cstate,gen_port,OR_TRAN_IPV4,vni);
  psVar5 = gen_loadx_iphdrlen(cstate);
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 0x87;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  b1 = (block *)newchunk(cstate,0x120);
  (b1->s).code = 0x1d;
  b1->head = b1;
  b1->stmts = psVar5;
  (b1->s).k = 0;
  gen_and(pbVar4,b1);
  pbVar4 = gen_geneve_check(cstate,gen_port6,OR_TRAN_IPV6,vni);
  psVar6 = gen_abs_offset_varpart(cstate,&cstate->off_linkpl);
  psVar5 = (slist *)newchunk(cstate,0x28);
  (psVar5->s).code = 0;
  (psVar5->s).k = 0x28;
  psVar1 = psVar6;
  if (psVar6 != (slist *)0x0) {
    do {
      psVar7 = psVar1;
      psVar1 = psVar7->next;
    } while (psVar1 != (slist *)0x0);
    psVar7->next = psVar5;
    psVar5 = (slist *)newchunk(cstate,0x28);
    (psVar5->s).code = 0xc;
    (psVar5->s).k = 0;
    psVar1 = psVar6;
    do {
      psVar7 = psVar1;
      psVar1 = psVar7->next;
    } while (psVar1 != (slist *)0x0);
    psVar7->next = psVar5;
    psVar5 = psVar6;
  }
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 7;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  b1_00 = (block *)newchunk(cstate,0x120);
  (b1_00->s).code = 0x1d;
  b1_00->head = b1_00;
  b1_00->stmts = psVar5;
  (b1_00->s).k = 0;
  gen_and(pbVar4,b1_00);
  gen_or(b1,b1_00);
  psVar5 = (slist *)newchunk(cstate,0x28);
  (psVar5->s).code = 4;
  (psVar5->s).k = (cstate->off_linkpl).constant_part + 8 + cstate->off_nl;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 7;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 4;
  (psVar6->s).k = 2;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  iVar3 = alloc_reg(cstate);
  (cstate->off_linktype).reg = iVar3;
  (cstate->off_linktype).is_variable = 1;
  (cstate->off_linktype).constant_part = 0;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 2;
  (psVar6->s).k = (cstate->off_linktype).reg;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 0x50;
  (psVar6->s).k = 0;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 0x54;
  (psVar6->s).k = 0x3f;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 0x24;
  (psVar6->s).k = 4;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 4;
  (psVar6->s).k = 8;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 0xc;
  (psVar6->s).k = 0;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  cstate->prevlinktype = cstate->linktype;
  uVar2 = (cstate->off_linkhdr).constant_part;
  (cstate->off_prevlinkhdr).is_variable = (cstate->off_linkhdr).is_variable;
  (cstate->off_prevlinkhdr).constant_part = uVar2;
  (cstate->off_prevlinkhdr).reg = (cstate->off_linkhdr).reg;
  cstate->linktype = 1;
  (cstate->off_linkhdr).is_variable = 1;
  (cstate->off_linkhdr).constant_part = 0;
  iVar3 = alloc_reg(cstate);
  (cstate->off_linkhdr).reg = iVar3;
  cstate->is_geneve = 0;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 2;
  (psVar6->s).k = (cstate->off_linkhdr).reg;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  cstate->no_optimize = 1;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 0x48;
  (psVar6->s).k = 2;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 0x61;
  (psVar6->s).k = (cstate->off_linkhdr).reg;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 0x15;
  (psVar6->s).k = 0x6558;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  psVar7 = (slist *)newchunk(cstate,0x28);
  (psVar7->s).code = 0x87;
  psVar1 = psVar5;
  do {
    psVar8 = psVar1;
    psVar1 = psVar8->next;
  } while (psVar1 != (slist *)0x0);
  psVar8->next = psVar7;
  (psVar6->s).jt = psVar7;
  psVar7 = (slist *)newchunk(cstate,0x28);
  (psVar7->s).code = 4;
  (psVar7->s).k = 0xc;
  psVar1 = psVar5;
  do {
    psVar8 = psVar1;
    psVar1 = psVar8->next;
  } while (psVar1 != (slist *)0x0);
  psVar8->next = psVar7;
  psVar7 = (slist *)newchunk(cstate,0x28);
  (psVar7->s).code = 2;
  (psVar7->s).k = (cstate->off_linktype).reg;
  psVar1 = psVar5;
  do {
    psVar8 = psVar1;
    psVar1 = psVar8->next;
  } while (psVar1 != (slist *)0x0);
  psVar8->next = psVar7;
  psVar7 = (slist *)newchunk(cstate,0x28);
  (psVar7->s).code = 4;
  (psVar7->s).k = 2;
  psVar1 = psVar5;
  do {
    psVar8 = psVar1;
    psVar1 = psVar8->next;
  } while (psVar1 != (slist *)0x0);
  psVar8->next = psVar7;
  psVar7 = (slist *)newchunk(cstate,0x28);
  (psVar7->s).code = 7;
  psVar1 = psVar5;
  do {
    psVar8 = psVar1;
    psVar1 = psVar8->next;
  } while (psVar1 != (slist *)0x0);
  psVar8->next = psVar7;
  iVar3 = alloc_reg(cstate);
  (cstate->off_linkpl).reg = iVar3;
  (cstate->off_linkpl).is_variable = 1;
  (cstate->off_linkpl).constant_part = 0;
  psVar7 = (slist *)newchunk(cstate,0x28);
  (psVar7->s).code = 3;
  (psVar7->s).k = (cstate->off_linkpl).reg;
  psVar1 = psVar5;
  do {
    psVar8 = psVar1;
    psVar1 = psVar8->next;
  } while (psVar1 != (slist *)0x0);
  psVar8->next = psVar7;
  (psVar6->s).jf = psVar7;
  cstate->off_nl = 0;
  psVar6 = (slist *)newchunk(cstate,0x28);
  (psVar6->s).code = 0;
  (psVar6->s).k = 0;
  pbVar4 = (block *)newchunk(cstate,0x120);
  (pbVar4->s).code = 0x15;
  pbVar4->head = pbVar4;
  psVar1 = psVar5;
  do {
    psVar7 = psVar1;
    psVar1 = psVar7->next;
  } while (psVar1 != (slist *)0x0);
  psVar7->next = psVar6;
  pbVar4->stmts = psVar5;
  gen_and(b1_00,pbVar4);
  cstate->is_geneve = 1;
  return pbVar4;
}

Assistant:

struct block *
gen_geneve(compiler_state_t *cstate, int vni)
{
	struct block *b0, *b1;
	struct slist *s;

	b0 = gen_geneve4(cstate, vni);
	b1 = gen_geneve6(cstate, vni);

	gen_or(b0, b1);
	b0 = b1;

	/* Later filters should act on the payload of the Geneve frame,
	 * update all of the header pointers. Attach this code so that
	 * it gets executed in the event that the Geneve filter matches. */
	s = gen_geneve_offsets(cstate);

	b1 = gen_true(cstate);
	sappend(s, b1->stmts);
	b1->stmts = s;

	gen_and(b0, b1);

	cstate->is_geneve = 1;

	return b1;
}